

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O2

bool __thiscall Am_Font_Data::Get_Font(Am_Font_Data *this,Display *dpy,XFontStruct **xfont)

{
  Font_Index *pFVar1;
  Font_Index **ppFVar2;
  
  ppFVar2 = &this->font_head;
  do {
    pFVar1 = *ppFVar2;
    if (pFVar1 == (Font_Index *)0x0) {
LAB_0027e3de:
      return pFVar1 != (Font_Index *)0x0;
    }
    if (pFVar1->dpy == dpy) {
      *xfont = pFVar1->xfont;
      goto LAB_0027e3de;
    }
    ppFVar2 = &pFVar1->next;
  } while( true );
}

Assistant:

bool
Am_Font_Data::Get_Font(Display *dpy, XFontStruct *&xfont)
{
  Font_Index *current;
  for (current = font_head; current != nullptr; current = current->next)
    if (current->dpy == dpy) {
      xfont = current->xfont;
      return true;
    }
  return false;
}